

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O3

JavascriptBigInt * Js::JavascriptBigInt::New(JavascriptBigInt *pbi,ScriptContext *scriptContext)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  JavascriptBigInt *this;
  unsigned_long *puVar7;
  size_t sizeInBytes;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if (pbi->m_maxLength < pbi->m_length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x26,"(pbi->m_maxLength >= pbi->m_length)",
                                "pbi->m_maxLength >= pbi->m_length");
    if (!bVar3) goto LAB_00d21055;
    *puVar5 = 0;
  }
  local_60 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_82e85b8;
  data.filename._0_4_ = 0x27;
  pRVar6 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
  this = (JavascriptBigInt *)new<Memory::Recycler>(0x30,pRVar6,0x387914);
  JavascriptBigInt(this,(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                        bigintTypeStatic).ptr);
  data.plusSize = pbi->m_maxLength;
  this->m_length = pbi->m_length;
  this->m_maxLength = data.plusSize;
  this->m_isNegative = pbi->m_isNegative;
  local_60 = (undefined1  [8])&unsigned_long::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_82e85b8;
  data.filename._0_4_ = 0x2b;
  pRVar6 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
  uVar1 = pbi->m_maxLength;
  if (uVar1 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar6,(TrackAllocData *)0x0);
    puVar7 = (unsigned_long *)&DAT_00000008;
  }
  else {
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      data._32_8_ = __tls_get_addr(&PTR_01548f08);
      *(undefined4 *)data._32_8_ = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00d21055;
      *(undefined4 *)data._32_8_ = 0;
    }
    puVar7 = (unsigned_long *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                       (pRVar6,-(ulong)(uVar1 >> 0x3d != 0) | uVar1 << 3);
    if (puVar7 == (unsigned_long *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00d21055:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      puVar7 = (unsigned_long *)0x0;
    }
  }
  Memory::Recycler::WBSetBit((char *)&this->m_digits);
  (this->m_digits).ptr = puVar7;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_digits);
  sizeInBytes = this->m_length << 3;
  js_memcpy_s((this->m_digits).ptr,sizeInBytes,(pbi->m_digits).ptr,sizeInBytes);
  return this;
}

Assistant:

JavascriptBigInt * JavascriptBigInt::New(JavascriptBigInt * pbi, ScriptContext * scriptContext)
    {
        Assert(pbi->m_maxLength >= pbi->m_length);
        JavascriptBigInt * bigintNew = RecyclerNew(scriptContext->GetRecycler(), JavascriptBigInt, scriptContext->GetLibrary()->GetBigIntTypeStatic());
        bigintNew->m_length = pbi->m_length;
        bigintNew->m_maxLength = pbi->m_maxLength;
        bigintNew->m_isNegative = pbi->m_isNegative;
        bigintNew->m_digits = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), digit_t, pbi->m_maxLength);
        js_memcpy_s(bigintNew->m_digits, bigintNew->m_length * sizeof(digit_t), pbi->m_digits, bigintNew->m_length * sizeof(digit_t));
 
        return bigintNew;
    }